

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__set
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  uint *puVar8;
  StringHash SVar9;
  void *pvVar10;
  char cVar11;
  xmlChar **ppxVar12;
  bool failed;
  ParserChar *attributeValue;
  bool local_139;
  ParserChar *local_138;
  StackMemoryManager *local_130;
  URI *local_128;
  uint *local_120;
  URI local_118;
  
  local_130 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
  puVar8 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x130);
  uVar2 = set__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar8 = set__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar8 + 2) = uVar2;
  uVar2 = set__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar8 + 4) = set__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar8 + 6) = uVar2;
  uVar2 = set__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(puVar8 + 8) = set__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(puVar8 + 10) = uVar2;
  *(undefined8 *)(puVar8 + 0xc) = set__AttributeData::DEFAULT._48_8_;
  local_128 = (URI *)(puVar8 + 0xe);
  COLLADABU::URI::URI(local_128,(URI *)(set__AttributeData::DEFAULT + 0x38),false);
  uVar5 = set__AttributeData::DEFAULT._300_4_;
  uVar4 = set__AttributeData::DEFAULT._296_4_;
  uVar3 = set__AttributeData::DEFAULT._292_4_;
  puVar8[0x48] = set__AttributeData::DEFAULT._288_4_;
  puVar8[0x49] = uVar3;
  puVar8[0x4a] = uVar4;
  puVar8[0x4b] = uVar5;
  *attributeDataPtr = puVar8;
  ppxVar12 = attributes->attributes;
  if (ppxVar12 != (xmlChar **)0x0) {
    local_120 = puVar8 + 0x48;
    do {
      text = *ppxVar12;
      if (text == (ParserChar *)0x0) {
        cVar11 = '\x03';
      }
      else {
        SVar9 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_138 = ppxVar12[1];
        if ((long)SVar9 < 0x7f8b6) {
          if (SVar9 == 0x6f4) {
            *(ParserChar **)(puVar8 + 0xc) = local_138;
            goto LAB_0075c857;
          }
          if (SVar9 != 0x6f8b6) {
            if (SVar9 == 0x7c065) {
              *(ParserChar **)(puVar8 + 2) = local_138;
            }
            else {
LAB_0075c735:
              if (*(long *)local_120 == 0) {
                pvVar10 = GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x10);
              }
              else {
                pvVar10 = GeneratedSaxParser::StackMemoryManager::growObject(local_130,0x10);
              }
              *(void **)(puVar8 + 0x48) = pvVar10;
              lVar1 = *(long *)(puVar8 + 0x4a);
              *(ParserChar **)((long)pvVar10 + lVar1 * 8) = text;
              *(ParserChar **)(*(long *)(puVar8 + 0x48) + 8 + lVar1 * 8) = local_138;
              *(long *)(puVar8 + 0x4a) = lVar1 + 2;
            }
            goto LAB_0075c857;
          }
          GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
          COLLADABU::URI::operator=(local_128,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if (local_139 == true) {
            bVar7 = false;
            bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x79c4,0x6f8b6,local_138);
            if (!bVar6) goto LAB_0075c7d1;
            cVar11 = '\x01';
          }
          else {
LAB_0075c7d1:
            cVar11 = '\x04';
            bVar7 = true;
            if (local_139 == false) {
              *(byte *)puVar8 = (byte)*puVar8 | 2;
            }
          }
          if (bVar7) goto LAB_0075c857;
        }
        else {
          if (SVar9 == 0x7f8b6) {
            *(ParserChar **)(puVar8 + 10) = local_138;
          }
          else if (SVar9 == 0x6a28a3) {
            bVar7 = GeneratedSaxParser::
                    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                    ::
                    characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                              (&this->
                                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ,local_138,(XSList<GeneratedSaxParser::ParserString> *)(puVar8 + 4));
            if (bVar7) {
              *(byte *)puVar8 = (byte)*puVar8 | 1;
              cVar11 = '\x04';
              bVar7 = true;
            }
            else {
              bVar7 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x79c4,0x6a28a3,local_138);
              bVar7 = !bVar7;
              cVar11 = bVar7 * '\x03' + '\x01';
            }
            if (!bVar7) goto LAB_0075c859;
          }
          else {
            if (SVar9 != 0x7ac025) goto LAB_0075c735;
            *(ParserChar **)(puVar8 + 8) = local_138;
          }
LAB_0075c857:
          cVar11 = '\0';
        }
LAB_0075c859:
        ppxVar12 = ppxVar12 + 2;
      }
    } while (cVar11 == '\0');
    if (cVar11 != '\x03') {
      return false;
    }
  }
  if ((*puVar8 & 1) == 0) {
    puVar8[4] = 0;
    puVar8[5] = 0;
    puVar8[6] = 0;
    puVar8[7] = 0;
  }
  if ((*puVar8 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(local_128,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__set( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__set( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

set__AttributeData* attributeData = newData<set__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_SET, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SET,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_SET,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= set__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SET,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= set__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & set__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & set__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}